

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

bool __thiscall brynet::net::EventLoop::wakeup(EventLoop *this)

{
  bool bVar1;
  pointer this_00;
  EventLoop *this_local;
  
  bVar1 = isInLoopThread(this);
  if (((bVar1) || (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->mIsInBlock), !bVar1))
     || (bVar1 = std::atomic<bool>::exchange(&this->mIsAlreadyPostWakeup,true,memory_order_seq_cst),
        bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = std::
              unique_ptr<brynet::net::WakeupChannel,_std::default_delete<brynet::net::WakeupChannel>_>
              ::operator->(&this->mWakeupChannel);
    WakeupChannel::wakeup(this_00);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EventLoop::wakeup()
{
    if (!isInLoopThread() && mIsInBlock && !mIsAlreadyPostWakeup.exchange(true))
    {
        mWakeupChannel->wakeup();
        return true;
    }

    return false;
}